

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O1

void tc_free(void *__ptr)

{
  if (base::internal::delete_hooks_ != 0) {
    tcmalloc::InvokeDeleteHookSlow(__ptr);
  }
  DebugDeallocate(__ptr,-0x10325470,0);
  return;
}

Assistant:

PERFTOOLS_DLL_DECL void tc_free(void* ptr) PERFTOOLS_NOTHROW {
  tcmalloc::InvokeDeleteHook(ptr);
  DebugDeallocate(ptr, MallocBlock::kMallocType, 0);
  force_frame();
}